

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

mask * csv_whitespace::make_table(void)

{
  unsigned_short *__result;
  unsigned_short *__first;
  mask *v;
  
  __result = (unsigned_short *)operator_new__(0x200);
  __first = (unsigned_short *)std::ctype<char>::classic_table();
  std::copy_n<unsigned_short_const*,unsigned_long,unsigned_short*>(__first,0x100,__result);
  __result[0x2c] = __result[0x2c] | 0x2000;
  __result[0x20] = 0xc04;
  return __result;
}

Assistant:

static mask* make_table()
    {
        auto* v = new mask[table_size];
        std::copy_n(classic_table(), table_size, v);

        // Comma will be classified as whitespace.
        v[static_cast<int>(',')] |= space;

        // Space will be classified as character with graphic representation.
        v[static_cast<int>(' ')] = graph;

        return v;
    }